

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::Compressed2DFormatCase::init
          (Compressed2DFormatCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *context;
  ContextInfo *contextInfo;
  int iVar1;
  deUint32 dVar2;
  int extraout_EAX;
  Texture2D *this_00;
  TexDecompressionParams local_70;
  int local_6c;
  undefined1 local_68 [4];
  int i;
  Random rnd;
  deUint8 *data;
  undefined1 local_38 [4];
  int dataSize;
  CompressedTexture compressedTexture;
  Compressed2DFormatCase *this_local;
  
  compressedTexture.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)this;
  tcu::CompressedTexture::CompressedTexture
            ((CompressedTexture *)local_38,this->m_format,this->m_width,this->m_height,1);
  iVar1 = tcu::CompressedTexture::getDataSize((CompressedTexture *)local_38);
  rnd.m_rnd._8_8_ = tcu::CompressedTexture::getData((CompressedTexture *)local_38);
  de::Random::Random((Random *)local_68,this->m_randomSeed);
  for (local_6c = 0; local_6c < iVar1; local_6c = local_6c + 1) {
    dVar2 = de::Random::getUint32((Random *)local_68);
    *(char *)(rnd.m_rnd._8_8_ + (long)local_6c) = (char)dVar2;
  }
  this_00 = (Texture2D *)operator_new(0x70);
  context = this->m_renderCtx;
  contextInfo = this->m_renderCtxInfo;
  tcu::TexDecompressionParams::TexDecompressionParams(&local_70,ASTCMODE_LAST);
  glu::Texture2D::Texture2D(this_00,context,contextInfo,1,(CompressedTexture *)local_38,&local_70);
  this->m_texture = this_00;
  de::Random::~Random((Random *)local_68);
  tcu::CompressedTexture::~CompressedTexture((CompressedTexture *)local_38);
  return extraout_EAX;
}

Assistant:

void Compressed2DFormatCase::init (void)
{
	// Create texture.
	tcu::CompressedTexture	compressedTexture	(m_format, m_width, m_height);
	int						dataSize			= compressedTexture.getDataSize();
	deUint8*				data				= (deUint8*)compressedTexture.getData();
	de::Random				rnd					(m_randomSeed);

	for (int i = 0; i < dataSize; i++)
		data[i] = rnd.getUint32() & 0xff;

	m_texture = new glu::Texture2D(m_renderCtx, m_renderCtxInfo, 1, &compressedTexture);
}